

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AddsPragma_Test::
CppMetadataTest_AddsPragma_Test(CppMetadataTest_AddsPragma_Test *this)

{
  CppMetadataTest_AddsPragma_Test *this_local;
  
  CppMetadataTest::CppMetadataTest(&this->super_CppMetadataTest);
  (this->super_CppMetadataTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CppMetadataTest_AddsPragma_Test_02a02958;
  return;
}

Assistant:

TEST_F(CppMetadataTest, AddsPragma) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kSmallTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_TRUE(pb_h.find("#ifdef guard_name") != std::string::npos);
  EXPECT_TRUE(pb_h.find("#pragma pragma_name \"test.pb.h.meta\"") !=
              std::string::npos);
}